

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O1

bool senjo::NumberParam<int>(string *name,int *value,char **params,bool *invalid)

{
  size_t __n;
  int iVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  __n = name->_M_string_length;
  if ((((__n == 0) || (pcVar6 = *params, pcVar6 == (char *)0x0)) ||
      (iVar1 = strncmp(pcVar6,(name->_M_dataplus)._M_p,__n), iVar1 != 0)) ||
     ((pcVar6[__n] != '\0' && (iVar1 = isspace((int)pcVar6[__n]), iVar1 == 0)))) {
    bVar3 = false;
  }
  else {
    *params = pcVar6 + __n;
    cVar2 = pcVar6[__n];
    bVar3 = true;
    if (cVar2 != '\0') {
      pcVar6 = pcVar6 + __n;
      do {
        pcVar6 = pcVar6 + 1;
        iVar1 = isspace((int)cVar2);
        if (iVar1 == 0) break;
        *params = pcVar6;
        cVar2 = *pcVar6;
      } while (cVar2 != '\0');
    }
  }
  if (bVar3 != false) {
    pcVar6 = *params;
    if ((pcVar6 != (char *)0x0) && ((int)*pcVar6 - 0x30U < 10)) {
      pcVar5 = pcVar6 + 1;
      *params = pcVar5;
      iVar1 = *pcVar6 + -0x30;
      *value = iVar1;
      cVar2 = pcVar6[1];
      iVar4 = (int)cVar2;
      if (iVar4 - 0x30U < 10) {
        pcVar6 = pcVar6 + 2;
        do {
          pcVar5 = pcVar6;
          *params = pcVar5;
          iVar1 = (int)pcVar5[-1] + iVar1 * 10 + -0x30;
          *value = iVar1;
          cVar2 = *pcVar5;
          iVar4 = (int)cVar2;
          pcVar6 = pcVar5 + 1;
        } while (iVar4 - 0x30U < 10);
      }
      if ((cVar2 == '\0') || (iVar1 = isspace(iVar4), iVar1 != 0)) {
        cVar2 = *pcVar5;
        while( true ) {
          if (cVar2 == '\0') {
            return bVar3;
          }
          pcVar5 = pcVar5 + 1;
          iVar1 = isspace((int)cVar2);
          if (iVar1 == 0) break;
          *params = pcVar5;
          cVar2 = *pcVar5;
        }
        return bVar3;
      }
    }
    *invalid = true;
  }
  return bVar3;
}

Assistant:

static inline bool NumberParam(const std::string& name, Number& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  if (!params || !*params || !isdigit(*params)) {
    invalid = true;
  }
  else {
    value = (*params++ - '0');
    while (*params && isdigit(*params)) {
      value = ((10 * value) + (*params++ - '0'));
    }
    if (*params && !isspace(*params)) {
      invalid = true;
    }
    else {
      NextWord(params);
    }
  }
  return true;
}